

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsHasProperty(JsValueRef object,JsPropertyIdRef propertyId,bool *hasProperty)

{
  int iVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  JavascriptLibrary *pJVar4;
  Type TVar5;
  bool bVar6;
  BOOL BVar7;
  JsErrorCode JVar8;
  RecyclableObject *this;
  undefined4 *puVar9;
  JsrtContext *pJVar10;
  Type TVar11;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_f8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  TTDRecorder local_b8;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  JsValueRef local_58;
  JsValueRef object_local;
  JsPropertyIdRef propertyId_local;
  bool *hasProperty_local;
  Type TStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (object == (JsValueRef)0x0) {
    JVar8 = JsErrorInvalidArgument;
  }
  else {
    local_58 = object;
    object_local = propertyId;
    propertyId_local = hasProperty;
    BVar7 = Js::JavascriptOperators::IsObject(object);
    if (BVar7 == 0) {
      return JsErrorArgumentNotObject;
    }
    this = Js::VarTo<Js::RecyclableObject>(object);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_003737d2;
      *puVar9 = 0;
    }
    TVar11 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar11) && (BVar7 = Js::RecyclableObject::IsExternal(this), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar6) goto LAB_003737d2;
      *puVar9 = 0;
    }
    TStack_38.ptr = (RuntimeFunction *)__tls_get_addr(&PTR_01548f08);
    while (TVar11 != TypeIds_Null) {
      if (TVar11 == TypeIds_Proxy) {
        __enterScriptObject.library = (JavascriptLibrary *)&object_local;
        local_b8.m_actionEvent = (EventLogEntry *)0x0;
        local_b8.m_resultPtr = (TTDVar *)0x0;
        pJVar10 = JsrtContext::GetCurrent();
        if (pJVar10 == (JsrtContext *)0x0) goto LAB_0037329c;
        pSVar2 = (((pJVar10->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
        ;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)((long)&hasProperty_local + 4),
                   ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
        TVar5.ptr = TStack_38.ptr;
        __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
        __entryExitRecord.scriptContext = (ScriptContext *)0x0;
        __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
        __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
        auStack_f8 = (undefined1  [8])0x0;
        __entryExitRecord._0_1_ = 0;
        __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
        __entryExitRecord._2_6_ = 0;
        __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
        Js::EnterScriptObject::EnterScriptObject
                  ((EnterScriptObject *)local_a0,pSVar2,(ScriptEntryExitRecord *)auStack_f8,
                   unaff_retaddr,&stack0x00000000,true,true,true);
        Js::ScriptContext::OnScriptStart(pSVar2,true,true);
        Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
        JVar8 = JsHasProperty::anon_class_24_3_132321e7::operator()
                          ((anon_class_24_3_132321e7 *)&__enterScriptObject.library,pSVar2,&local_b8
                          );
        Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
        if (((JVar8 & 0x6ffff) == JsErrorOutOfMemory) ||
           ((((JVar8 - JsErrorNoCurrentContext < 7 &&
              ((0x43U >> (JVar8 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
             (JVar8 == JsErrorFatal)) || (JVar8 == JsErrorScriptTerminated)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)
           &((TVar5.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                             ,0xcc,
                             "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                             ,
                             "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                            );
          if (!bVar6) goto LAB_003737d2;
          *(undefined4 *)
           &((TVar5.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)((long)&hasProperty_local + 4));
        if ((JavascriptLibrary *)local_b8.m_actionEvent == (JavascriptLibrary *)0x0) {
          return JVar8;
        }
        iVar1 = *(int *)((long)&(((JavascriptLibraryBase *)&(local_b8.m_actionEvent)->EventKind)->
                                super_FinalizableObject).super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject + 4);
        pJVar4 = (JavascriptLibrary *)local_b8.m_actionEvent;
        goto joined_r0x0037318e;
      }
      this = Js::RecyclableObject::GetPrototype(this);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        TVar5.ptr = TStack_38.ptr;
        *(undefined4 *)
         &((TStack_38.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar6) goto LAB_003737d2;
        *(undefined4 *)
         &((TVar5.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
      }
      TVar11 = ((this->type).ptr)->typeId;
      if ((0x57 < (int)TVar11) && (BVar7 = Js::RecyclableObject::IsExternal(this), BVar7 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        TVar5.ptr = TStack_38.ptr;
        *(undefined4 *)
         &((TStack_38.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar6) goto LAB_003737d2;
        *(undefined4 *)
         &((TVar5.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
      }
    }
    local_a0 = (undefined1  [8])&object_local;
    __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)&local_58;
    __enterScriptObject._8_8_ = &propertyId_local;
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    pJVar10 = JsrtContext::GetCurrent();
    if (pJVar10 == (JsrtContext *)0x0) {
LAB_0037329c:
      JVar8 = JsErrorNoCurrentContext;
    }
    else {
      pSVar2 = (((pJVar10->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)auStack_f8,
                 ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      TVar5.ptr = TStack_38.ptr;
      JVar8 = JsHasProperty::anon_class_24_3_132321e7::operator()
                        ((anon_class_24_3_132321e7 *)local_a0,pSVar2,
                         (TTDRecorder *)&__enterScriptObject.library);
      if (((JVar8 - JsErrorNoCurrentContext < 7) &&
          ((0x43U >> (JVar8 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
         ((JVar8 == JsErrorOutOfMemory ||
          ((JVar8 == JsErrorFatal || ((JVar8 & 0xfffffffd) == JsErrorScriptException)))))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)
         &((TVar5.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0x11f,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar6) {
LAB_003737d2:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *(undefined4 *)
         &((TVar5.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)auStack_f8);
      if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
        iVar1 = *(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                                super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject + 4);
        pJVar4 = __enterScriptObject.library;
joined_r0x0037318e:
        if (iVar1 != -1) {
          TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
        }
        *(JsErrorCode *)
         ((long)&(pJVar4->super_JavascriptLibraryBase).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar8;
      }
    }
  }
  return JVar8;
}

Assistant:

CHAKRA_API JsHasProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId, _Out_ bool *hasProperty)
{
    VALIDATE_JSREF(object);
    if (!Js::JavascriptOperators::IsObject(object)) return JsErrorArgumentNotObject;

    auto internalHasProperty = [&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTHasProperty, (Js::PropertyRecord *)propertyId, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(hasProperty);
        *hasProperty = false;

        Js::RecyclableObject * instance = Js::VarTo<Js::RecyclableObject>(object);
        *hasProperty = Js::JavascriptOperators::HasProperty(instance, ((Js::PropertyRecord *)propertyId)->GetPropertyId()) != 0;

        return JsNoError;
    };

    Js::RecyclableObject* robject = Js::VarTo<Js::RecyclableObject>(object);
    Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(robject);
    while (typeId != Js::TypeIds_Null && typeId != Js::TypeIds_Proxy)
    {
        robject = robject->GetPrototype();
        typeId = Js::JavascriptOperators::GetTypeId(robject);
    }

    if (typeId == Js::TypeIds_Proxy)
    {
        return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
    }
#ifdef _CHAKRACOREBUILD
    else if (typeId == Js::TypeIds_Object)
    {
        // CEOs can also have traps so we would want the Enter/Leave semantics for those.
        Js::CustomExternalWrapperObject * externalWrapper = Js::JavascriptOperators::TryFromVar<Js::CustomExternalWrapperObject>(object);
        if (externalWrapper)
        {
            return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
        }
    }
#endif

    return ContextAPINoScriptWrapper(internalHasProperty);
}